

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.hpp
# Opt level: O2

Cycles __thiscall
Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::CommaVid>::perform_bus_operation
          (Cartridge<Atari2600::Cartridge::CommaVid> *this,BusOperation operation,uint16_t address,
          uint8_t *value)

{
  PIA *this_00;
  Cycles *pCVar1;
  uint __fd;
  long lVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  uint8_t *__n;
  void *__buf;
  uint uVar8;
  undefined1 auVar9 [16];
  
  iVar5 = 3;
  if (operation == Ready) {
    iVar5 = TIA::get_cycles_until_horizontal_blank
                      (&(this->super_Bus).tia_,
                       (Cycles)(this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>
                               .length_);
  }
  lVar2 = (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
  auVar9._0_8_ = (long)iVar5;
  auVar9._8_4_ = iVar5;
  auVar9._12_4_ = iVar5 >> 0x1f;
  (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_ =
       auVar9._0_8_ +
       (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_;
  (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ =
       auVar9._8_8_ + lVar2;
  pCVar1 = &(this->super_Bus).cycles_since_6532_update_;
  (pCVar1->super_WrappedInt<Cycles>).length_ =
       (pCVar1->super_WrappedInt<Cycles>).length_ + (long)(iVar5 / 3);
  if ((int)operation < 4 || operation == Write) {
    __fd = (uint)address;
    __n = value;
    CommaVid::perform_bus_operation(&this->bus_extender_,operation,address,value);
    bVar3 = 0xff;
    if ((__fd & 0x1280) == 0x80) {
      if ((int)operation < 5) {
        bVar3 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.ram_[__fd & 0x7f];
      }
      else {
        __n = (uint8_t *)(ulong)(__fd & 0x7f);
        __n[(long)&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>] = *value;
      }
    }
    if ((address & 0x1080) == 0) {
      if ((int)operation < 5) {
        uVar8 = address & 0xf;
        if ((ushort)uVar8 < 0xe) {
          __n = (uint8_t *)(ulong)uVar8;
          if ((char)(1 << (sbyte)uVar8) == '\0') {
            if ((0xf00U >> uVar8 & 1) == 0) {
              bVar3 = bVar3 & (this->super_Bus).tia_input_value_[uVar8 - 0xc];
            }
            else {
              bVar3 = 0;
            }
          }
          else {
            bVar4 = TIA::get_collision_flags(&(this->super_Bus).tia_,uVar8);
            bVar3 = bVar3 & bVar4;
          }
        }
      }
      else {
        uVar8 = address & 0x3f;
        if ((ushort)uVar8 < 0x2d) {
          __n = (uint8_t *)
                ((long)&switchD_002b86cc::switchdataD_00458224 +
                (long)(int)(&switchD_002b86cc::switchdataD_00458224)[uVar8]);
          switch(uVar8) {
          case 0:
            Bus::update_video(&this->super_Bus);
            TIA::set_sync(&(this->super_Bus).tia_,(bool)((*value & 2) >> 1));
            break;
          case 1:
            Bus::update_video(&this->super_Bus);
            TIA::set_blank(&(this->super_Bus).tia_,(bool)((*value & 2) >> 1));
            break;
          case 2:
            (this->m6502_).super_ProcessorBase.super_ProcessorStorage.ready_line_is_enabled_ = true;
            break;
          case 3:
            Bus::update_video(&this->super_Bus);
            TIA::reset_horizontal_counter(&(this->super_Bus).tia_);
            this->horizontal_counter_resets_ = this->horizontal_counter_resets_ + 1;
            break;
          case 4:
          case 5:
            Bus::update_video(&this->super_Bus);
            TIA::set_player_number_and_size(&(this->super_Bus).tia_,uVar8 - 4,*value);
            break;
          case 6:
          case 7:
            Bus::update_video(&this->super_Bus);
            TIA::set_player_missile_colour(&(this->super_Bus).tia_,uVar8 - 6,*value);
            break;
          case 8:
            Bus::update_video(&this->super_Bus);
            TIA::set_playfield_ball_colour(&(this->super_Bus).tia_,*value);
            break;
          case 9:
            Bus::update_video(&this->super_Bus);
            TIA::set_background_colour(&(this->super_Bus).tia_,*value);
            break;
          case 10:
            Bus::update_video(&this->super_Bus);
            TIA::set_playfield_control_and_ball_size(&(this->super_Bus).tia_,*value);
            break;
          case 0xb:
          case 0xc:
            Bus::update_video(&this->super_Bus);
            TIA::set_player_reflected(&(this->super_Bus).tia_,uVar8 - 0xb,(*value & 8) == 0);
            break;
          default:
            Bus::update_video(&this->super_Bus);
            TIA::set_playfield(&(this->super_Bus).tia_,(ushort)uVar8 - 0xd,*value);
            break;
          case 0x10:
          case 0x11:
            Bus::update_video(&this->super_Bus);
            TIA::set_player_position(&(this->super_Bus).tia_,uVar8 - 0x10);
            break;
          case 0x12:
          case 0x13:
            Bus::update_video(&this->super_Bus);
            TIA::set_missile_position(&(this->super_Bus).tia_,uVar8 - 0x12);
            break;
          case 0x14:
            Bus::update_video(&this->super_Bus);
            TIA::set_ball_position(&(this->super_Bus).tia_);
            break;
          case 0x15:
          case 0x16:
            Bus::update_audio(&this->super_Bus);
            TIASound::set_control(&(this->super_Bus).tia_sound_,uVar8 - 0x15,*value);
            break;
          case 0x17:
          case 0x18:
            Bus::update_audio(&this->super_Bus);
            TIASound::set_divider(&(this->super_Bus).tia_sound_,uVar8 - 0x17,*value);
            break;
          case 0x19:
          case 0x1a:
            Bus::update_audio(&this->super_Bus);
            TIASound::set_volume(&(this->super_Bus).tia_sound_,uVar8 - 0x19,*value);
            break;
          case 0x1b:
          case 0x1c:
            Bus::update_video(&this->super_Bus);
            TIA::set_player_graphic(&(this->super_Bus).tia_,uVar8 - 0x1b,*value);
            break;
          case 0x1d:
          case 0x1e:
            Bus::update_video(&this->super_Bus);
            TIA::set_missile_enable(&(this->super_Bus).tia_,uVar8 - 0x1d,(bool)((*value & 2) >> 1));
            break;
          case 0x1f:
            Bus::update_video(&this->super_Bus);
            TIA::set_ball_enable(&(this->super_Bus).tia_,(bool)((*value & 2) >> 1));
            break;
          case 0x20:
          case 0x21:
            Bus::update_video(&this->super_Bus);
            TIA::set_player_motion(&(this->super_Bus).tia_,uVar8 - 0x20,*value);
            break;
          case 0x22:
          case 0x23:
            Bus::update_video(&this->super_Bus);
            TIA::set_missile_motion(&(this->super_Bus).tia_,uVar8 - 0x22,*value);
            break;
          case 0x24:
            Bus::update_video(&this->super_Bus);
            TIA::set_ball_motion(&(this->super_Bus).tia_,*value);
            break;
          case 0x25:
          case 0x26:
            TIA::set_player_delay(&(this->super_Bus).tia_,uVar8 - 0x25,(bool)(*value & 1));
            break;
          case 0x27:
            TIA::set_ball_delay(&(this->super_Bus).tia_,(bool)(*value & 1));
            break;
          case 0x28:
          case 0x29:
            Bus::update_video(&this->super_Bus);
            TIA::set_missile_position_to_player
                      (&(this->super_Bus).tia_,uVar8 - 0x28,(bool)((*value & 2) >> 1));
            break;
          case 0x2a:
            Bus::update_video(&this->super_Bus);
            TIA::move(&(this->super_Bus).tia_);
            break;
          case 0x2b:
            Bus::update_video(&this->super_Bus);
            TIA::clear_motion(&(this->super_Bus).tia_);
            break;
          case 0x2c:
            Bus::update_video(&this->super_Bus);
            TIA::clear_collision_flags(&(this->super_Bus).tia_);
          }
        }
      }
    }
    if ((__fd & 0x1280) == 0x280) {
      Bus::update_6532(&this->super_Bus);
      this_00 = &(this->super_Bus).mos6532_;
      if (4 < (int)operation) {
        MOS::MOS6532<Atari2600::PIA>::write
                  (&this_00->super_MOS6532<Atari2600::PIA>,__fd,(void *)(ulong)*value,(size_t)__n);
        goto LAB_002b867e;
      }
      sVar7 = MOS::MOS6532<Atari2600::PIA>::read
                        (&this_00->super_MOS6532<Atari2600::PIA>,__fd,__buf,(size_t)__n);
      bVar3 = (byte)sVar7 & bVar3;
    }
    else if (4 < (int)operation) goto LAB_002b867e;
    *value = *value & bVar3;
  }
LAB_002b867e:
  iVar6 = TIA::get_cycles_until_horizontal_blank
                    (&(this->super_Bus).tia_,
                     (Cycles)(this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.
                             length_);
  if (iVar6 == 0) {
    (this->m6502_).super_ProcessorBase.super_ProcessorStorage.ready_is_active_ = false;
    (this->m6502_).super_ProcessorBase.super_ProcessorStorage.ready_line_is_enabled_ = false;
  }
  return (Cycles)(WrappedInt<Cycles>)(long)(iVar5 / 3);
}

Assistant:

Cycles perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			uint8_t returnValue = 0xff;
			int cycles_run_for = 3;

			// this occurs as a feedback loop: the 2600 requests ready, then performs the cycles_run_for
			// leap to the end of ready only once ready is signalled because on a 6502 ready doesn't take
			// effect until the next read; therefore it isn't safe to assume that signalling ready immediately
			// skips to the end of the line.
			if(operation == CPU::MOS6502::BusOperation::Ready)
				cycles_run_for = tia_.get_cycles_until_horizontal_blank(cycles_since_video_update_);

			cycles_since_speaker_update_ += Cycles(cycles_run_for);
			cycles_since_video_update_ += Cycles(cycles_run_for);
			cycles_since_6532_update_ += Cycles(cycles_run_for / 3);
			bus_extender_.advance_cycles(cycles_run_for / 3);

			if(isAccessOperation(operation)) {
				// give the cartridge a chance to respond to the bus access
				bus_extender_.perform_bus_operation(operation, address, value);

				// check for a RIOT RAM access
				if((address&0x1280) == 0x80) {
					if(isReadOperation(operation)) {
						returnValue &= mos6532_.get_ram(address);
					} else {
						mos6532_.set_ram(address, *value);
					}
				}

				// check for a TIA access
				if(!(address&0x1080)) {
					if(isReadOperation(operation)) {
						const uint16_t decodedAddress = address & 0xf;
						switch(decodedAddress) {
							case 0x00:		// missile 0 / player collisions
							case 0x01:		// missile 1 / player collisions
							case 0x02:		// player 0 / playfield / ball collisions
							case 0x03:		// player 1 / playfield / ball collisions
							case 0x04:		// missile 0 / playfield / ball collisions
							case 0x05:		// missile 1 / playfield / ball collisions
							case 0x06:		// ball / playfield collisions
							case 0x07:		// player / player, missile / missile collisions
								returnValue &= tia_.get_collision_flags(decodedAddress);
							break;

							case 0x08:
							case 0x09:
							case 0x0a:
							case 0x0b:
								// TODO: pot ports
								returnValue &= 0;
							break;

							case 0x0c:
							case 0x0d:
								returnValue &= tia_input_value_[decodedAddress - 0x0c];
							break;
						}
					} else {
						const uint16_t decodedAddress = address & 0x3f;
						switch(decodedAddress) {
							case 0x00:	update_video(); tia_.set_sync(*value & 0x02);		break;
							case 0x01:	update_video();	tia_.set_blank(*value & 0x02);		break;

							case 0x02:	m6502_.set_ready_line(true);						break;
							case 0x03:
								update_video();
								tia_.reset_horizontal_counter();
								horizontal_counter_resets_++;
							break;
								// TODO: audio will now be out of synchronisation. Fix.

							case 0x04:
							case 0x05:	update_video();	tia_.set_player_number_and_size(decodedAddress - 0x04, *value);	break;
							case 0x06:
							case 0x07:	update_video();	tia_.set_player_missile_colour(decodedAddress - 0x06, *value);		break;
							case 0x08:	update_video();	tia_.set_playfield_ball_colour(*value);								break;
							case 0x09:	update_video();	tia_.set_background_colour(*value);									break;
							case 0x0a:	update_video();	tia_.set_playfield_control_and_ball_size(*value);					break;
							case 0x0b:
							case 0x0c:	update_video();	tia_.set_player_reflected(decodedAddress - 0x0b, !((*value)&8));	break;
							case 0x0d:
							case 0x0e:
							case 0x0f:	update_video();	tia_.set_playfield(decodedAddress - 0x0d, *value);					break;
							case 0x10:
							case 0x11:	update_video(); tia_.set_player_position(decodedAddress - 0x10);					break;
							case 0x12:
							case 0x13:	update_video(); tia_.set_missile_position(decodedAddress - 0x12);					break;
							case 0x14:	update_video();	tia_.set_ball_position();											break;
							case 0x1b:
							case 0x1c:	update_video(); tia_.set_player_graphic(decodedAddress - 0x1b, *value);				break;
							case 0x1d:
							case 0x1e:	update_video(); tia_.set_missile_enable(decodedAddress - 0x1d, (*value)&2);			break;
							case 0x1f:	update_video(); tia_.set_ball_enable((*value)&2);									break;
							case 0x20:
							case 0x21:	update_video(); tia_.set_player_motion(decodedAddress - 0x20, *value);				break;
							case 0x22:
							case 0x23:	update_video(); tia_.set_missile_motion(decodedAddress - 0x22, *value);				break;
							case 0x24:	update_video(); tia_.set_ball_motion(*value);										break;
							case 0x25:
							case 0x26:	tia_.set_player_delay(decodedAddress - 0x25, (*value)&1);							break;
							case 0x27:	tia_.set_ball_delay((*value)&1);													break;
							case 0x28:
							case 0x29:	update_video(); tia_.set_missile_position_to_player(decodedAddress - 0x28, (*value)&2);		break;
							case 0x2a:	update_video(); tia_.move();														break;
							case 0x2b:	update_video(); tia_.clear_motion();												break;
							case 0x2c:	update_video(); tia_.clear_collision_flags();										break;

							case 0x15:
							case 0x16:	update_audio(); tia_sound_.set_control(decodedAddress - 0x15, *value);				break;
							case 0x17:
							case 0x18:	update_audio(); tia_sound_.set_divider(decodedAddress - 0x17, *value);				break;
							case 0x19:
							case 0x1a:	update_audio(); tia_sound_.set_volume(decodedAddress - 0x19, *value);				break;
						}
					}
				}

				// check for a PIA access
				if((address&0x1280) == 0x280) {
					update_6532();
					if(isReadOperation(operation)) {
						returnValue &= mos6532_.read(address);
					} else {
						mos6532_.write(address, *value);
					}
				}

				if(isReadOperation(operation)) {
					*value &= returnValue;
				}
			}

			if(!tia_.get_cycles_until_horizontal_blank(cycles_since_video_update_)) m6502_.set_ready_line(false);

			return Cycles(cycles_run_for / 3);
		}